

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O2

void __thiscall CubicLattice::createFaces(CubicLattice *this)

{
  int iVar1;
  int vertexIndex;
  long lVar2;
  double dVar3;
  cartesian4 cVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  allocator_type local_11a;
  allocator_type local_119;
  allocator local_118;
  allocator local_117;
  allocator local_116;
  allocator local_115;
  int local_114;
  Lattice *local_110;
  string *local_108;
  string *local_100;
  int local_f8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  double local_d0;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_108 = local_90;
  vertexIndex = 0;
  local_114 = 0;
  local_110 = &this->super_Lattice;
  local_100 = local_108;
  while( true ) {
    local_d0 = (double)vertexIndex;
    dVar3 = pow((double)(this->super_Lattice).l,3.0);
    if (dVar3 <= local_d0) break;
    cVar4 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
    iVar1 = (this->super_Lattice).l + -1;
    if (iVar1 != cVar4.z) {
      if (iVar1 != cVar4.y && iVar1 != cVar4.x) {
        if (cVar4.z < (this->super_Lattice).l + -2) {
          if (cVar4.x != 0) {
            std::__cxx11::string::string((string *)&local_b0,"y",&local_115);
            std::__cxx11::string::string(local_90,"z",&local_116);
            std::__cxx11::string::string(local_70,"z",&local_117);
            std::__cxx11::string::string(local_50,"y",&local_118);
            __l._M_len = 4;
            __l._M_array = &local_b0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_e8,__l,&local_119);
            local_f8[0] = 1;
            local_f8[1] = 1;
            local_f8[2] = 1;
            local_f8[3] = 1;
            __l_00._M_len = 4;
            __l_00._M_array = local_f8;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_c8,__l_00,&local_11a);
            Lattice::addFace(local_110,vertexIndex,local_114,&local_e8,(vint *)&local_c8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_e8);
            lVar2 = 0x60;
            do {
              std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar2));
              lVar2 = lVar2 + -0x20;
            } while (lVar2 != -0x20);
            local_114 = local_114 + 1;
          }
          if (cVar4._0_8_ >> 0x20 != 0) {
            std::__cxx11::string::string((string *)&local_b0,"x",&local_115);
            std::__cxx11::string::string(local_90,"z",&local_116);
            std::__cxx11::string::string(local_70,"z",&local_117);
            std::__cxx11::string::string(local_50,"x",&local_118);
            __l_01._M_len = 4;
            __l_01._M_array = &local_b0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_e8,__l_01,&local_119);
            local_f8[0] = 1;
            local_f8[1] = 1;
            local_f8[2] = 1;
            local_f8[3] = 1;
            __l_02._M_len = 4;
            __l_02._M_array = local_f8;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_c8,__l_02,&local_11a);
            Lattice::addFace(local_110,vertexIndex,local_114,&local_e8,(vint *)&local_c8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_e8);
            lVar2 = 0x60;
            do {
              std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar2));
              lVar2 = lVar2 + -0x20;
            } while (lVar2 != -0x20);
            local_114 = local_114 + 1;
          }
        }
        std::__cxx11::string::string((string *)&local_b0,"x",&local_115);
        std::__cxx11::string::string(local_90,"y",&local_116);
        std::__cxx11::string::string(local_70,"y",&local_117);
        std::__cxx11::string::string(local_50,"x",&local_118);
        __l_03._M_len = 4;
        __l_03._M_array = &local_b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_e8,__l_03,&local_119);
        local_f8[0] = 1;
        local_f8[1] = 1;
        local_f8[2] = 1;
        local_f8[3] = 1;
        __l_04._M_len = 4;
        __l_04._M_array = local_f8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_c8,__l_04,&local_11a);
        Lattice::addFace(local_110,vertexIndex,local_114,&local_e8,(vint *)&local_c8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e8);
        lVar2 = 0x60;
        do {
          std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar2));
          lVar2 = lVar2 + -0x20;
        } while (lVar2 != -0x20);
        local_114 = local_114 + 1;
        this = (CubicLattice *)local_110;
      }
    }
    vertexIndex = vertexIndex + 1;
  }
  return;
}

Assistant:

void CubicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.z == l - 1 || coordinate.x == l - 1 || coordinate.y == l - 1)
        {
            continue;
        }
        if (coordinate.z < l - 2)
        {
            if (!(coordinate.x == 0))
            {
                // Add yz face
                addFace(vertexIndex, faceIndex, {"y", "z", "z", "y"}, {1, 1, 1, 1});
                ++faceIndex;
            }
            if (!(coordinate.y == 0))
            {
                // Add xz face
                addFace(vertexIndex, faceIndex, {"x", "z", "z", "x"}, {1, 1, 1, 1});
                ++faceIndex;
            }
        }
        // Add xy face
        addFace(vertexIndex, faceIndex, {"x", "y", "y", "x"}, {1, 1, 1, 1});
        ++faceIndex;
    }
}